

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supdup.c
# Opt level: O2

char * supdup_init(BackendVtable *x,Seat *seat,Backend **backend_handle,LogContext *logctx,
                  Conf *conf,char *host,int port,char **realhost,_Bool nodelay,_Bool keepalive)

{
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  Supdup *supdup;
  Conf *conf_00;
  char *pcVar5;
  SockAddr *addr;
  Socket *pSVar6;
  Pinger *pPVar7;
  char *pcVar8;
  ulong uVar9;
  
  supdup = (Supdup *)safemalloc(1,0xc0,0);
  memset(supdup,0,0xc0);
  (supdup->plug).vt = &supdup_init::fn_table;
  (supdup->backend).vt = &supdup_backend;
  (supdup->interactor).vt = &Supdup_interactorvt;
  (supdup->backend).interactor = &supdup->interactor;
  supdup->logctx = logctx;
  conf_00 = conf_copy(conf);
  supdup->conf = conf_00;
  supdup->s = (Socket *)0x0;
  supdup->socket_connected = false;
  supdup->closed_on_socket_error = false;
  supdup->seat = seat;
  iVar3 = conf_get_int(conf_00,0x7d);
  supdup->term_width = iVar3;
  iVar3 = conf_get_int(supdup->conf,0x7e);
  supdup->term_height = iVar3;
  supdup->pinger = (Pinger *)0x0;
  supdup->sent_location = false;
  pcVar5 = default_description((supdup->backend).vt,host,port);
  supdup->description = pcVar5;
  *backend_handle = &supdup->backend;
  uVar4 = conf_get_int(supdup->conf,0x45);
  if (uVar4 < 3) {
    supdup->print = (_func_void_strbuf_ptr_int *)(&PTR_print_ascii_001a5310)[uVar4];
  }
  iVar3 = conf_get_int(supdup->conf,3);
  pcVar5 = " (IPv6)";
  if (iVar3 != 2) {
    pcVar5 = anon_var_dwarf_30ff5 + 10;
  }
  pcVar8 = " (IPv4)";
  if (iVar3 != 1) {
    pcVar8 = pcVar5;
  }
  pcVar5 = dupprintf("Looking up host \"%s\"%s",host,pcVar8);
  logevent(supdup->logctx,pcVar5);
  safefree(pcVar5);
  addr = name_lookup(host,port,realhost,supdup->conf,iVar3,(LogContext *)0x0,
                     anon_var_dwarf_30ff5 + 10);
  pcVar5 = sk_addr_error(addr);
  if (pcVar5 == (char *)0x0) {
    iVar3 = 0x5f;
    if (-1 < port) {
      iVar3 = port;
    }
    pSVar6 = new_connection(addr,*realhost,iVar3,false,true,nodelay,keepalive,&supdup->plug,
                            supdup->conf,&supdup->interactor);
    supdup->s = pSVar6;
    pcVar5 = (*pSVar6->vt->socket_error)(pSVar6);
    if (pcVar5 == (char *)0x0) {
      pPVar7 = pinger_new(supdup->conf,&supdup->backend);
      supdup->pinger = pPVar7;
      (*supdup->seat->vt->update_specials_menu)(supdup->seat);
      pcVar5 = conf_get_str(supdup->conf,9);
      if (*pcVar5 != '\0') {
        safefree(*realhost);
        pcVar5 = dupstr(pcVar5);
        *realhost = pcVar5;
        pcVar5 = host_strrchr(pcVar5,0x3a);
        if (pcVar5 != (char *)0x0) {
          *pcVar5 = '\0';
        }
      }
      iVar3 = conf_get_int(supdup->conf,0x45);
      _Var1 = conf_get_bool(supdup->conf,0x46);
      _Var2 = conf_get_bool(supdup->conf,0x47);
      uVar9 = 0x1744c0028;
      if (iVar3 == 0) {
        uVar9 = 0x1444c0028;
      }
      supdup->ttyopt = uVar9 | (uint)_Var1 << 0x19 | (ulong)_Var2 << 0x18;
      supdup->tcmxh = (long)supdup->term_width + -1;
      supdup->tcmxv = (long)supdup->term_height;
      supdup_send_36bits(supdup,0xfffec0000);
      supdup_send_36bits(supdup,7);
      supdup_send_36bits(supdup,supdup->ttyopt);
      supdup_send_36bits(supdup,supdup->tcmxv);
      supdup_send_36bits(supdup,supdup->tcmxh);
      supdup_send_36bits(supdup,1);
      supdup->state = CONNECTING;
      (*supdup->seat->vt->set_trust_status)(supdup->seat,false);
      c_write(supdup,(uchar *)"\x1b%G",3);
      return (char *)0x0;
    }
  }
  else {
    sk_addr_free(addr);
  }
  pcVar5 = dupstr(pcVar5);
  return pcVar5;
}

Assistant:

static char *supdup_init(const BackendVtable *x, Seat *seat,
                         Backend **backend_handle,
                         LogContext *logctx, Conf *conf,
                         const char *host, int port, char **realhost,
                         bool nodelay, bool keepalive)
{
    static const PlugVtable fn_table = {
        .log = supdup_log,
        .closing = supdup_closing,
        .receive = supdup_receive,
        .sent = supdup_sent,
    };
    SockAddr *addr;
    const char *err;
    Supdup *supdup;
    char *loghost;
    int addressfamily;
    const char *utf8 = "\033%G";

    supdup = snew(struct supdup_tag);
    memset(supdup, 0, sizeof(Supdup));
    supdup->plug.vt = &fn_table;
    supdup->backend.vt = &supdup_backend;
    supdup->interactor.vt = &Supdup_interactorvt;
    supdup->backend.interactor = &supdup->interactor;
    supdup->logctx = logctx;
    supdup->conf = conf_copy(conf);
    supdup->s = NULL;
    supdup->socket_connected = false;
    supdup->closed_on_socket_error = false;
    supdup->seat = seat;
    supdup->term_width = conf_get_int(supdup->conf, CONF_width);
    supdup->term_height = conf_get_int(supdup->conf, CONF_height);
    supdup->pinger = NULL;
    supdup->sent_location = false;
    supdup->description = default_description(supdup->backend.vt, host, port);
    *backend_handle = &supdup->backend;

    switch (conf_get_int(supdup->conf, CONF_supdup_ascii_set)) {
    case SUPDUP_CHARSET_ASCII:
      supdup->print = print_ascii;
      break;
    case SUPDUP_CHARSET_ITS:
      supdup->print = print_its;
      break;
    case SUPDUP_CHARSET_WAITS:
      supdup->print = print_waits;
      break;
    }

    /*
     * Try to find host.
     */
    {
        char *buf;
        addressfamily = conf_get_int(supdup->conf, CONF_addressfamily);
        buf = dupprintf("Looking up host \"%s\"%s", host,
                        (addressfamily == ADDRTYPE_IPV4 ? " (IPv4)" :
                         (addressfamily == ADDRTYPE_IPV6 ? " (IPv6)" :
                          "")));
        logevent(supdup->logctx, buf);
        sfree(buf);
    }
    addr = name_lookup(host, port, realhost, supdup->conf, addressfamily, NULL, "");
    if ((err = sk_addr_error(addr)) != NULL) {
        sk_addr_free(addr);
        return dupstr(err);
    }

    if (port < 0)
        port = 0137;            /* default supdup port */

    /*
     * Open socket.
     */
    supdup->s = new_connection(addr, *realhost, port, false, true,
                               nodelay, keepalive, &supdup->plug, supdup->conf,
                               &supdup->interactor);
    if ((err = sk_socket_error(supdup->s)) != NULL)
        return dupstr(err);

    supdup->pinger = pinger_new(supdup->conf, &supdup->backend);

    /*
     * We can send special commands from the start.
     */
    seat_update_specials_menu(supdup->seat);

    /*
     * loghost overrides realhost, if specified.
     */
    loghost = conf_get_str(supdup->conf, CONF_loghost);
    if (*loghost) {
        char *colon;

        sfree(*realhost);
        *realhost = dupstr(loghost);

        colon = host_strrchr(*realhost, ':');
        if (colon)
            *colon++ = '\0';
    }

    /*
     * Set up TTYOPTS based on config
     */
    int ascii_set = conf_get_int(supdup->conf, CONF_supdup_ascii_set);
    int more_processing = conf_get_bool(supdup->conf, CONF_supdup_more);
    int scrolling = conf_get_bool(supdup->conf, CONF_supdup_scroll);
    supdup->ttyopt =
        TOERS |
        TOMVB |
        (ascii_set == SUPDUP_CHARSET_ASCII ? 0 : TOSAI | TOSA1) |
        TOMVU |
        TOLWR |
        TOLID |
        TOCID |
        TPCBS |
        (scrolling ? TOROL : 0) |
        (more_processing ? TOMOR : 0) |
        TPORS;

    supdup->tcmxh = supdup->term_width - 1;             // -1 "..one column is used to indicate line continuation."
    supdup->tcmxv = supdup->term_height;

    /*
     * Send our configuration words to the server
     */
    supdup_send_config(supdup);

    /*
     * We next expect a connection message followed by %TDNOP from the server
     */
    supdup->state = CONNECTING;
    seat_set_trust_status(supdup->seat, false);

    /* Make sure the terminal is in UTF-8 mode. */
    c_write(supdup, (unsigned char *)utf8, strlen(utf8));

    return NULL;
}